

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner2::openStream(Runner2 *this)

{
  Config *this_00;
  ulong uVar1;
  undefined8 uVar2;
  ostream *poVar3;
  domain_error *this_01;
  streambuf *buf;
  string local_1b8 [48];
  ostringstream local_188 [8];
  ostringstream oss;
  Runner2 *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Config::useStream(this->m_configWrapper,&this->m_config->stream);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar2 = std::__cxx11::string::c_str();
    std::ofstream::open(&this->m_ofs,uVar2,0x10);
    uVar1 = std::ios::fail();
    if ((uVar1 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_188);
      poVar3 = std::operator<<((ostream *)local_188,"Unable to open file: \'");
      poVar3 = std::operator<<(poVar3,(string *)&this->m_config->outputFilename);
      std::operator<<(poVar3,"\'");
      this_01 = (domain_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::domain_error::domain_error(this_01,local_1b8);
      __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
    this_00 = this->m_configWrapper;
    buf = (streambuf *)std::ofstream::rdbuf();
    Config::setStreamBuf(this_00,buf);
  }
  return;
}

Assistant:

void openStream() {
            if( !m_config.stream.empty() )
                m_configWrapper.useStream( m_config.stream );

            // Open output file, if specified
            if( !m_config.outputFilename.empty() ) {
                m_ofs.open( m_config.outputFilename.c_str() );
                if( m_ofs.fail() ) {
                    std::ostringstream oss;
                    oss << "Unable to open file: '" << m_config.outputFilename << "'";
                    throw std::domain_error( oss.str() );
                }
                m_configWrapper.setStreamBuf( m_ofs.rdbuf() );
            }
        }